

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

Info * __thiscall CMU462::Halfedge::getInfo_abi_cxx11_(Info *__return_storage_ptr__,Halfedge *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf8;
  ostringstream m8;
  ostringstream m7;
  ostringstream m6;
  ostringstream m5;
  ostringstream m4;
  ostringstream m3;
  ostringstream m2;
  ostringstream m1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m4);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m5);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m6);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m7);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m8);
  std::operator<<((ostream *)&m1,"HALFEDGE");
  poVar2 = std::operator<<((ostream *)&m2,"Address: ");
  std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<((ostream *)&m3,"Twin: ");
  std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<((ostream *)&m4,"Next: ");
  std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<((ostream *)&m5,"Vertex: ");
  std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<((ostream *)&m6,"Edge: ");
  std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<((ostream *)&m7,"Face: ");
  std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<((ostream *)&m8,"Boundary: ");
  pcVar3 = "NO";
  if (*(char *)&(this->_face)._M_node[0xc]._M_next != '\0') {
    pcVar3 = "YES";
  }
  std::operator<<(poVar2,pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  paVar1 = &local_bf8.field_2;
  local_bf8._M_string_length = 0;
  local_bf8.field_2._M_local_buf[0] = '\0';
  local_bf8._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  local_bf8._M_string_length = 0;
  local_bf8.field_2._M_local_buf[0] = '\0';
  local_bf8._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  local_bf8._M_string_length = 0;
  local_bf8.field_2._M_local_buf[0] = '\0';
  local_bf8._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_bf8);
  std::__cxx11::string::~string((string *)&local_bf8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m7);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m6);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m5);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m4);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m1);
  return __return_storage_ptr__;
}

Assistant:

Info Halfedge::getInfo()
  {
    Info info;

    ostringstream m1, m2, m3, m4, m5, m6, m7, m8;
    m1 << "HALFEDGE";
    m2 << "Address: "  << this;
    m3 << "Twin: "     << elementAddress(twin());
    m4 << "Next: "     << elementAddress(next());
    m5 << "Vertex: "   << elementAddress(vertex());
    m6 << "Edge: "     << elementAddress(edge());
    m7 << "Face: "     << elementAddress(face());
    m8 << "Boundary: " << (isBoundary() ? "YES" : "NO");

    info.reserve(8);
    info.push_back(m1.str());
    info.push_back(string());
    info.push_back(m2.str());
    info.push_back(m3.str());
    info.push_back(m4.str());
    info.push_back(string());
    info.push_back(m5.str());
    info.push_back(m6.str());
    info.push_back(m7.str());
    info.push_back(string());
    info.push_back(m8.str());

    return info;
  }